

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t mtree_atol8(char **p)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  uint local_2c;
  int base;
  int digit;
  int64_t last_digit_limit;
  int64_t limit;
  int64_t l;
  char **p_local;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  lVar5 = SUB168((auVar3 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(8),0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
  limit = 0;
  cVar1 = **p;
  while( true ) {
    local_2c = (int)cVar1 - 0x30;
    if (7 < local_2c) {
      return limit;
    }
    if ((lVar5 < limit) ||
       ((limit == lVar5 &&
        (SUB168((auVar4 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816(8),0) < (long)(int)local_2c
        )))) break;
    limit = limit * 8 + (long)(int)local_2c;
    pcVar2 = *p;
    *p = pcVar2 + 1;
    cVar1 = pcVar2[1];
  }
  return 0x7fffffffffffffff;
}

Assistant:

static int64_t
mtree_atol8(char **p)
{
	int64_t	l, limit, last_digit_limit;
	int digit, base;

	base = 8;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	l = 0;
	digit = **p - '0';
	while (digit >= 0 && digit < base) {
		if (l>limit || (l == limit && digit > last_digit_limit)) {
			l = INT64_MAX; /* Truncate on overflow. */
			break;
		}
		l = (l * base) + digit;
		digit = *++(*p) - '0';
	}
	return (l);
}